

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int diff_nims_list(nifti_image *s0,nifti_image *s1,str_list *slist,int display)

{
  char **ppcVar1;
  int iVar2;
  field_s *fieldp;
  int iVar3;
  long lVar4;
  
  if (slist->len < 1) {
    iVar3 = 0;
  }
  else {
    ppcVar1 = slist->list;
    lVar4 = 0;
    iVar3 = 0;
    do {
      fieldp = get_nim_field(ppcVar1[lVar4],1);
      if ((fieldp != (field_s *)0x0) && (iVar2 = diff_field(fieldp,s0,s1,1), iVar2 != 0)) {
        if (display != 0) {
          disp_field((char *)0x0,fieldp,s0,1,(uint)(iVar3 == 0));
          disp_field((char *)0x0,fieldp,s1,1,0);
        }
        iVar3 = iVar3 + 1;
      }
      lVar4 = lVar4 + 1;
    } while ((int)lVar4 < slist->len);
  }
  return iVar3;
}

Assistant:

int diff_nims_list( nifti_image * s0, nifti_image * s1, str_list * slist,
                    int display )
{
   field_s  * fp;
   char    ** sptr;
   int        c, ndiff = 0;

   sptr = slist->list;
   for( c = 0; c < slist->len; c++ )
   {
      fp = get_nim_field(*sptr, 1);    /* "not found" displayed in func */
      if( fp && diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }
      sptr++;
   }

   return ndiff;
}